

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall cmCTestTestHandler::PopulateCustomVectors(cmCTestTestHandler *this,cmMakefile *mf)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  cmValue v;
  ostream *poVar4;
  ostringstream cmCTestLog_msg;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_198 + 0x10;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CTEST_CUSTOM_PRE_TEST","");
  cmCTest::PopulateCustomVector(pcVar2,mf,(string *)local_198,&this->CustomPreTest);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CTEST_CUSTOM_POST_TEST","");
  cmCTest::PopulateCustomVector(pcVar2,mf,(string *)local_198,&this->CustomPostTest);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CTEST_CUSTOM_TESTS_IGNORE","");
  cmCTest::PopulateCustomVector(pcVar2,mf,(string *)local_198,&this->CustomTestsIgnore);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE","");
  cmCTest::PopulateCustomInteger
            (pcVar2,mf,(string *)local_198,&this->CustomMaximumPassedTestOutputSize);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE","");
  cmCTest::PopulateCustomInteger
            (pcVar2,mf,(string *)local_198,&this->CustomMaximumFailedTestOutputSize);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION","");
  v = cmMakefile::GetDefinition(mf,(string *)local_198);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if (v.Value != (string *)0x0) {
    bVar3 = SetTestOutputTruncation(this,v.Value);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Invalid value for CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION: ",0x37
                );
      poVar4 = operator<<((ostream *)local_198,v);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x171,(char *)local_1b8,false);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_PRE_TEST",
                                    this->CustomPreTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_POST_TEST",
                                    this->CustomPostTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_TESTS_IGNORE",
                                    this->CustomTestsIgnore);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",
    this->CustomMaximumPassedTestOutputSize);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",
    this->CustomMaximumFailedTestOutputSize);

  cmValue dval = mf->GetDefinition("CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION");
  if (dval) {
    if (!this->SetTestOutputTruncation(dval)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Invalid value for CTEST_CUSTOM_TEST_OUTPUT_TRUNCATION: "
                   << dval << std::endl);
    }
  }
}